

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer pbVar1;
  int iVar2;
  Config *pCVar3;
  TypeInfo *this;
  pointer child;
  allocator local_189;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dgos;
  string out_folder;
  string local_148;
  string in_folder;
  string local_108;
  string local_e8;
  ObjectFileDB db;
  
  puts("Jak Disassembler");
  init_crc();
  init_opcode_info();
  if (argc == 4) {
    std::__cxx11::string::string((string *)&db,argv[1],(allocator *)&in_folder);
    set_config((string *)&db);
    std::__cxx11::string::~string((string *)&db);
    std::__cxx11::string::string((string *)&in_folder,argv[2],(allocator *)&db);
    std::__cxx11::string::string((string *)&out_folder,argv[3],(allocator *)&db);
    dgos.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    dgos.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    dgos.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pCVar3 = get_config();
    pbVar1 = (pCVar3->dgo_names).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (child = (pCVar3->dgo_names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; child != pbVar1; child = child + 1) {
      combine_path((string *)&db,&in_folder,child);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&dgos,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&db);
      std::__cxx11::string::~string((string *)&db);
    }
    ObjectFileDB::ObjectFileDB(&db,&dgos);
    std::__cxx11::string::string((string *)&local_e8,"dgo.txt",&local_189);
    combine_path(&local_148,&out_folder,&local_e8);
    ObjectFileDB::generate_dgo_listing_abi_cxx11_(&local_108,&db);
    write_text_file(&local_148,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_e8);
    ObjectFileDB::process_link_data(&db);
    ObjectFileDB::find_code(&db);
    ObjectFileDB::process_labels(&db);
    pCVar3 = get_config();
    if (pCVar3->write_scripts == true) {
      ObjectFileDB::find_and_write_scripts(&db,&out_folder);
    }
    pCVar3 = get_config();
    if (pCVar3->write_hexdump == true) {
      pCVar3 = get_config();
      ObjectFileDB::write_object_file_words(&db,&out_folder,pCVar3->write_hexdump_on_v3_only);
    }
    ObjectFileDB::analyze_functions(&db);
    pCVar3 = get_config();
    if (pCVar3->write_disassembly == true) {
      pCVar3 = get_config();
      ObjectFileDB::write_disassembly(&db,&out_folder,pCVar3->disassemble_objects_without_functions)
      ;
    }
    this = get_type_info();
    TypeInfo::get_summary_abi_cxx11_(&local_148,this);
    puts(local_148._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_148);
    ObjectFileDB::~ObjectFileDB(&db);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&dgos);
    std::__cxx11::string::~string((string *)&out_folder);
    std::__cxx11::string::~string((string *)&in_folder);
    iVar2 = 0;
  }
  else {
    puts("usage: jak_disassembler <config_file> <in_folder> <out_folder>");
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv) {
  printf("Jak Disassembler\n");
  init_crc();
  init_opcode_info();

  if (argc != 4) {
    printf("usage: jak_disassembler <config_file> <in_folder> <out_folder>\n");
    return 1;
  }

  set_config(argv[1]);
  std::string in_folder = argv[2];
  std::string out_folder = argv[3];

  std::vector<std::string> dgos;
  for (const auto& dgo_name : get_config().dgo_names) {
    dgos.push_back(combine_path(in_folder, dgo_name));
  }

  ObjectFileDB db(dgos);
  write_text_file(combine_path(out_folder, "dgo.txt"), db.generate_dgo_listing());

  db.process_link_data();
  db.find_code();
  db.process_labels();

  if (get_config().write_scripts) {
    db.find_and_write_scripts(out_folder);
  }

  if (get_config().write_hexdump) {
    db.write_object_file_words(out_folder, get_config().write_hexdump_on_v3_only);
  }

  db.analyze_functions();

  if (get_config().write_disassembly) {
    db.write_disassembly(out_folder, get_config().disassemble_objects_without_functions);
  }

  printf("%s\n", get_type_info().get_summary().c_str());

  return 0;
}